

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
path<std::__cxx11::string,char_const*>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pathList,
          char *pathList_1)

{
  char *in_RDX;
  allocator local_69;
  string local_68 [48];
  undefined4 local_38;
  undefined4 local_34;
  anon_class_8_1_89901123 local_30;
  anon_class_8_1_89901123 append;
  char *pathList_local_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pathList_local;
  string *path;
  
  append.path._7_1_ = 0;
  std::__cxx11::string::string((string *)pathList);
  local_30.path = pathList;
  path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
  ::anon_class_8_1_89901123::operator()(&local_30,(string *)pathList_1);
  local_38 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,in_RDX,&local_69);
  path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
  ::anon_class_8_1_89901123::operator()(&local_30,(string *)local_68);
  local_34 = 0;
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  return pathList;
}

Assistant:

std::string path(T... pathList) {
    std::string path;
    auto append = [&path](const std::string &s) {
        if ((path.empty() || path.back() == '\\') || (!s.empty() && s.front() == '\\')) {
            path.append(s);
        } else {
            path.append(pathSeparator()).append(s);
        }
    };
    std::initializer_list<int>{(append(pathList), 0)...};
    return path;
}